

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O2

int Agi_ManSuppSizeTest(Agi_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = 0;
  aVar2 = Abc_Clock();
  for (lVar5 = 1; lVar5 < p->nObjs; lVar5 = lVar5 + 1) {
    if (p->pObjs[lVar5] < 0xfffffffbfffffffa) {
      iVar1 = Agi_ManSuppSizeOne(p,(int)lVar5);
      uVar4 = uVar4 + (iVar1 < 0x11);
    }
  }
  iVar1 = 0x6b1195;
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar4,(ulong)(uint)p->nNodes);
  aVar3 = Abc_Clock();
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return uVar4;
}

Assistant:

int Agi_ManSuppSizeTest( Agi_Man_t * p )
{
    abctime clk = Abc_Clock();
    int i, Counter = 0;
    Agi_ManForEachNode( p, i )
        Counter += (Agi_ManSuppSizeOne(p, i) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Agi_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;

}